

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::addSingleton(ISingleton *singleton)

{
  iterator __position;
  vector<Catch::ISingleton*,std::allocator<Catch::ISingleton*>> *pvVar1;
  ISingleton *in_RDI;
  ISingleton *local_10;
  
  if ((anonymous_namespace)::getSingletons()::g_singletons ==
      (vector<Catch::ISingleton*,std::allocator<Catch::ISingleton*>> *)0x0) {
    (anonymous_namespace)::getSingletons()::g_singletons =
         (vector<Catch::ISingleton*,std::allocator<Catch::ISingleton*>> *)operator_new(0x18);
    *(undefined8 *)(anonymous_namespace)::getSingletons()::g_singletons = 0;
    *(undefined8 *)((anonymous_namespace)::getSingletons()::g_singletons + 8) = 0;
    *(undefined8 *)((anonymous_namespace)::getSingletons()::g_singletons + 0x10) = 0;
  }
  pvVar1 = (anonymous_namespace)::getSingletons()::g_singletons;
  __position._M_current =
       *(ISingleton ***)((anonymous_namespace)::getSingletons()::g_singletons + 8);
  if (__position._M_current ==
      *(ISingleton ***)((anonymous_namespace)::getSingletons()::g_singletons + 0x10)) {
    std::vector<Catch::ISingleton*,std::allocator<Catch::ISingleton*>>::
    _M_realloc_insert<Catch::ISingleton*const&>
              ((anonymous_namespace)::getSingletons()::g_singletons,__position,&local_10);
  }
  else {
    *__position._M_current = in_RDI;
    *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
  }
  return;
}

Assistant:

void addSingleton(ISingleton *singleton) {
    getSingletons()->push_back(singleton);
  }